

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O2

void embree::alignedUSMFree(void *ptr)

{
  free(ptr);
  return;
}

Assistant:

void alignedUSMFree(void* ptr)
  {
#if defined(EMBREE_SYCL_SUPPORT)
    if (tls_context)
      return alignedSYCLFree(tls_context,ptr);
    else
#endif
      return alignedFree(ptr);
  }